

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  stbi_uc sVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  stbi_uc **ppsVar17;
  undefined8 *puVar18;
  stbi_uc *psVar19;
  size_t sVar20;
  stbi_uc *psVar21;
  byte *pbVar22;
  bool bVar23;
  uint color;
  char *pcVar24;
  ulong uVar25;
  stbi_uc *psVar26;
  ulong uVar27;
  uint uVar28;
  stbi__uint32 raw_len_00;
  long lVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  int local_52c;
  stbi_uc tc [3];
  ulong local_4d8;
  stbi__uint32 raw_len;
  ulong local_4b8;
  stbi_uc *local_4b0;
  stbi_uc *local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  stbi_uc *local_488;
  stbi__context *local_480;
  size_t local_478;
  int local_470;
  int local_46c;
  ulong local_468;
  size_t local_460;
  long local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar11 = stbi__check_png_header(s);
  if (iVar11 == 0) {
    local_52c = 0;
  }
  else {
    local_52c = 1;
    if (scan != 1) {
      ppsVar17 = &z->idata;
      puVar18 = (undefined8 *)__tls_get_addr(&PTR_0012ce18);
      local_4a0 = s->buffer_start;
      psVar1 = s->buffer_start + 1;
      bVar4 = true;
      local_468 = 0;
      color = 0;
      bVar5 = false;
      local_4d8 = 0;
      local_460 = 0;
      local_4b8 = 0;
      bVar6 = false;
      bVar7 = 0;
      do {
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar15 = uVar12 + iVar11 * 0x10000;
        uVar13 = stbi__get16be(s);
        uVar14 = stbi__get16be(s);
        psVar19 = local_4a0;
        uVar28 = uVar13 << 0x10 | uVar14;
        uVar30 = (uint)local_4d8;
        if ((int)uVar28 < 0x49484452) {
          if (uVar28 == 0x43674249) {
            bVar5 = true;
LAB_0011a806:
            stbi__skip(s,uVar15);
LAB_0011ab64:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar3 = true;
          }
          else {
            iVar11 = (int)local_4b8;
            if (uVar28 == 0x49444154) {
              if (bVar4) {
LAB_0011a8df:
                *puVar18 = "first not IHDR";
                bVar4 = true;
                goto LAB_0011a8f8;
              }
              if ((bVar7 != 0) && (uVar30 == 0)) {
                *puVar18 = "no PLTE";
                bVar4 = false;
                local_4d8 = 0;
                goto LAB_0011a8f8;
              }
              if (scan == 2) {
                s->img_n = (uint)bVar7;
LAB_0011abcd:
                local_52c = 1;
                bVar4 = false;
                goto LAB_0011abdd;
              }
              uVar12 = uVar15 + iVar11;
              if (iVar11 <= (int)uVar12) {
                if ((uint)local_460 < uVar12) {
                  sVar20 = 0x1000;
                  if (0x1000 < uVar15) {
                    sVar20 = (ulong)uVar15;
                  }
                  if ((uint)local_460 != 0) {
                    sVar20 = local_460 & 0xffffffff;
                  }
                  do {
                    local_460 = sVar20;
                    sVar20 = (ulong)((uint)local_460 * 2);
                  } while ((uint)local_460 < uVar12);
                  psVar19 = (stbi_uc *)realloc(*ppsVar17,local_460);
                  if (psVar19 == (stbi_uc *)0x0) {
                    *puVar18 = "outofmem";
                    bVar4 = false;
                    goto LAB_0011a935;
                  }
                  *ppsVar17 = psVar19;
                }
                iVar11 = stbi__getn(s,*ppsVar17 + (local_4b8 & 0xffffffff),uVar15);
                if (iVar11 != 0) {
                  local_4b8 = (ulong)uVar12;
                  bVar8 = bVar7;
LAB_0011b460:
                  bVar7 = bVar8;
                  bVar4 = false;
                  goto LAB_0011ab64;
                }
                pcVar24 = "outofdata";
                goto LAB_0011a920;
              }
LAB_0011a92b:
              bVar4 = false;
              goto LAB_0011a935;
            }
            if (uVar28 != 0x49454e44) {
LAB_0011a83f:
              if (bVar4) goto LAB_0011a8df;
              bVar4 = false;
              if ((uVar13 >> 0xd & 1) == 0) {
                stbi__parse_png_file::invalid_chunk[0] = (char)(uVar28 >> 0x18);
                stbi__parse_png_file::invalid_chunk[1] = (char)(uVar28 >> 0x10);
                stbi__parse_png_file::invalid_chunk[2] = (char)(uVar14 >> 8);
                stbi__parse_png_file::invalid_chunk[3] = (char)uVar14;
                pcVar24 = stbi__parse_png_file::invalid_chunk;
                goto LAB_0011ab84;
              }
              goto LAB_0011a806;
            }
            if (bVar4) {
              pcVar24 = "first not IHDR";
LAB_0011a74c:
              *puVar18 = pcVar24;
              local_52c = 0;
            }
            else if (scan == 0) {
              if (*ppsVar17 == (stbi_uc *)0x0) {
                pcVar24 = "no IDAT";
                goto LAB_0011a74c;
              }
              raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
              psVar19 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar17,iVar11,raw_len,(int *)&raw_len,(uint)!bVar5);
              z->expanded = psVar19;
              local_52c = 0;
              if (psVar19 != (stbi_uc *)0x0) {
                free(*ppsVar17);
                raw_len_00 = raw_len;
                *ppsVar17 = (stbi_uc *)0x0;
                iVar11 = s->img_n + 1;
                if (bVar6 || (bVar7 == 0 && req_comp != 3) && iVar11 == req_comp) {
                  s->img_out_n = iVar11;
                }
                else {
                  s->img_out_n = s->img_n;
                }
                iVar11 = s->img_out_n;
                iVar16 = z->depth;
                iVar31 = iVar11 << (iVar16 == 0x10);
                x = z->s->img_x;
                y = z->s->img_y;
                if ((int)local_468 == 0) {
                  iVar11 = stbi__create_png_image_raw(z,z->expanded,raw_len,iVar11,x,y,iVar16,color)
                  ;
                  if (iVar11 == 0) goto LAB_0011abdd;
                }
                else {
                  local_4a8 = z->expanded;
                  local_4b0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar31,0);
                  local_478 = (size_t)iVar31;
                  lVar33 = 0;
                  psVar19 = local_4a8;
                  local_470 = iVar11;
                  do {
                    psVar2 = z->s;
                    local_498 = (stbi_uc *)(long)(int)(&DAT_00123590)[lVar33];
                    uVar15 = (&DAT_001235d0)[lVar33];
                    uVar28 = ~(&DAT_00123590)[lVar33] + psVar2->img_x + uVar15;
                    uVar13 = uVar28 / uVar15;
                    uVar12 = (&DAT_001235f0)[lVar33];
                    local_480 = (stbi__context *)CONCAT44(local_480._4_4_,(&DAT_001235b0)[lVar33]);
                    uVar30 = ~(&DAT_001235b0)[lVar33] + psVar2->img_y + uVar12;
                    uVar14 = uVar30 / uVar12;
                    bVar23 = true;
                    if ((uVar15 <= uVar28) && (uVar12 <= uVar30)) {
                      local_46c = uVar13 * iVar16 * psVar2->img_n;
                      local_488 = (stbi_uc *)(long)(int)uVar15;
                      local_458 = lVar33;
                      iVar31 = stbi__create_png_image_raw
                                         (z,psVar19,raw_len_00,iVar11,uVar13,uVar14,iVar16,color);
                      if (iVar31 == 0) {
                        free(local_4b0);
                        bVar23 = false;
                        lVar33 = local_458;
                      }
                      else {
                        local_4a8 = psVar19;
                        if (0 < (int)uVar14) {
                          iVar11 = (int)local_478;
                          iVar31 = (int)local_480 * iVar11;
                          local_498 = local_4b0 + (long)local_498 * local_478;
                          lVar33 = (long)local_488 * local_478;
                          local_490 = 0;
                          sVar20 = local_478;
                          do {
                            if (0 < (int)uVar13) {
                              local_480 = z->s;
                              local_488 = z->out;
                              lVar29 = local_490 * (long)(int)uVar13;
                              lVar32 = 0;
                              psVar19 = local_498;
                              do {
                                memcpy(psVar19 + local_480->img_x * iVar31,
                                       local_488 + (lVar29 + lVar32) * sVar20,local_478);
                                lVar32 = lVar32 + 1;
                                psVar19 = psVar19 + lVar33;
                                sVar20 = local_478;
                              } while (lVar32 < (int)uVar13);
                            }
                            local_490 = local_490 + 1;
                            iVar31 = iVar31 + uVar12 * iVar11;
                          } while (local_490 < uVar14);
                        }
                        uVar14 = ((local_46c + 7 >> 3) + 1) * uVar14;
                        free(z->out);
                        psVar19 = local_4a8 + uVar14;
                        raw_len_00 = raw_len_00 - uVar14;
                        bVar23 = true;
                        lVar33 = local_458;
                        iVar11 = local_470;
                      }
                    }
                    if (!bVar23) goto LAB_0011abdd;
                    lVar33 = lVar33 + 1;
                  } while (lVar33 != 7);
                  z->out = local_4b0;
                }
                if (bVar6) {
                  if (z->depth == 0x10) {
                    stbi__compute_transparency16(z,tc16,s->img_out_n);
                  }
                  else {
                    stbi__compute_transparency(z,tc,s->img_out_n);
                  }
                }
                if (((bVar5) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                  stbi__de_iphone(z);
                }
                if (bVar7 == 0) {
                  if (bVar6) {
                    s->img_n = s->img_n + 1;
                  }
                }
                else {
                  s->img_n = (uint)bVar7;
                  uVar15 = (uint)bVar7;
                  if (2 < req_comp) {
                    uVar15 = req_comp;
                  }
                  s->img_out_n = uVar15;
                  psVar19 = z->out;
                  uVar12 = z->s->img_y * z->s->img_x;
                  psVar21 = (stbi_uc *)stbi__malloc_mad2(uVar12,uVar15,0);
                  if (psVar21 == (stbi_uc *)0x0) {
                    *puVar18 = "outofmem";
                  }
                  else {
                    if (uVar15 == 3) {
                      if (uVar12 != 0) {
                        uVar25 = 0;
                        psVar26 = psVar21;
                        do {
                          uVar27 = (ulong)psVar19[uVar25];
                          *psVar26 = palette[uVar27 * 4];
                          psVar26[1] = palette[uVar27 * 4 + 1];
                          psVar26[2] = palette[uVar27 * 4 + 2];
                          psVar26 = psVar26 + 3;
                          uVar25 = uVar25 + 1;
                        } while (uVar12 != uVar25);
                      }
                    }
                    else if (uVar12 != 0) {
                      uVar25 = 0;
                      do {
                        uVar27 = (ulong)psVar19[uVar25];
                        psVar21[uVar25 * 4] = palette[uVar27 * 4];
                        psVar21[uVar25 * 4 + 1] = palette[uVar27 * 4 + 1];
                        psVar21[uVar25 * 4 + 2] = palette[uVar27 * 4 + 2];
                        psVar21[uVar25 * 4 + 3] = palette[uVar27 * 4 + 3];
                        uVar25 = uVar25 + 1;
                      } while (uVar12 != uVar25);
                    }
                    free(psVar19);
                    z->out = psVar21;
                  }
                  if (psVar21 == (stbi_uc *)0x0) goto LAB_0011abdd;
                }
                free(z->expanded);
                z->expanded = (stbi_uc *)0x0;
                stbi__get16be(s);
                stbi__get16be(s);
                goto LAB_0011a94a;
              }
            }
            else {
LAB_0011a94a:
              local_52c = 1;
            }
LAB_0011abdd:
            bVar3 = false;
          }
        }
        else {
          if (uVar28 == 0x74524e53) {
            if (!bVar4) {
              if (*ppsVar17 == (stbi_uc *)0x0) {
                if (bVar7 == 0) {
                  if ((s->img_n & 1U) == 0) {
                    pcVar24 = "tRNS with alpha";
                  }
                  else {
                    if (s->img_n * 2 == uVar15) {
                      bVar6 = true;
                      if (z->depth == 0x10) {
                        if (0 < s->img_n) {
                          lVar33 = 0;
                          do {
                            iVar11 = stbi__get16be(s);
                            tc16[lVar33] = (stbi__uint16)iVar11;
                            lVar33 = lVar33 + 1;
                          } while (lVar33 < s->img_n);
                        }
                      }
                      else if (0 < s->img_n) {
                        lVar33 = 0;
                        do {
                          iVar11 = stbi__get16be(s);
                          tc[lVar33] = ""[z->depth] * (char)iVar11;
                          lVar33 = lVar33 + 1;
                        } while (lVar33 < s->img_n);
                      }
                      bVar4 = false;
                      bVar7 = 0;
                      goto LAB_0011ab64;
                    }
                    pcVar24 = "bad tRNS len";
                  }
                  *puVar18 = pcVar24;
                  bVar4 = false;
                  bVar7 = 0;
                  goto LAB_0011a8f8;
                }
                if (scan == 2) {
                  s->img_n = 4;
                  goto LAB_0011abcd;
                }
                if (uVar30 == 0) {
                  *puVar18 = "tRNS before PLTE";
                  bVar4 = false;
                  local_4d8 = 0;
                  goto LAB_0011a935;
                }
                if (uVar15 <= uVar30) {
                  bVar7 = 4;
                  bVar4 = false;
                  bVar8 = 4;
                  if (uVar15 == 0) goto LAB_0011b460;
                  uVar25 = 0;
                  do {
                    psVar21 = s->img_buffer;
                    if (psVar21 < s->img_buffer_end) {
LAB_0011b242:
                      s->img_buffer = psVar21 + 1;
                      sVar9 = *psVar21;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                        if (iVar16 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar19;
                          s->img_buffer_end = psVar1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar19;
                          s->img_buffer_end = psVar19 + iVar16;
                        }
                        psVar21 = s->img_buffer;
                        goto LAB_0011b242;
                      }
                      sVar9 = '\0';
                    }
                    palette[uVar25 * 4 + 3] = sVar9;
                    uVar25 = uVar25 + 1;
                  } while (uVar12 + iVar11 * 0x10000 != uVar25);
                  goto LAB_0011ab64;
                }
                pcVar24 = "bad tRNS len";
              }
              else {
                pcVar24 = "tRNS after IDAT";
              }
LAB_0011a920:
              *puVar18 = pcVar24;
              goto LAB_0011a92b;
            }
            *puVar18 = "first not IHDR";
            bVar4 = true;
LAB_0011a935:
            local_52c = 0;
            bVar3 = false;
            goto LAB_0011abdf;
          }
          if (uVar28 == 0x504c5445) {
            if (bVar4) goto LAB_0011a8df;
            if ((uVar15 < 0x301) &&
               (local_4d8 = (ulong)uVar12 * 0x55555556 >> 0x20,
               (int)((ulong)uVar12 * 0x55555556 >> 0x20) * 3 == uVar15)) {
              bVar4 = false;
              if (2 < uVar12) {
                uVar25 = 0;
                do {
                  psVar21 = s->img_buffer;
                  if (psVar21 < s->img_buffer_end) {
LAB_0011aa1a:
                    s->img_buffer = psVar21 + 1;
                    sVar9 = *psVar21;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar19;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar19;
                        s->img_buffer_end = psVar19 + iVar11;
                      }
                      psVar21 = s->img_buffer;
                      goto LAB_0011aa1a;
                    }
                    sVar9 = '\0';
                  }
                  palette[uVar25 * 4] = sVar9;
                  psVar21 = s->img_buffer;
                  if (psVar21 < s->img_buffer_end) {
LAB_0011aa94:
                    s->img_buffer = psVar21 + 1;
                    sVar9 = *psVar21;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar19;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar19;
                        s->img_buffer_end = psVar19 + iVar11;
                      }
                      psVar21 = s->img_buffer;
                      goto LAB_0011aa94;
                    }
                    sVar9 = '\0';
                  }
                  palette[uVar25 * 4 + 1] = sVar9;
                  psVar21 = s->img_buffer;
                  if (psVar21 < s->img_buffer_end) {
LAB_0011ab0e:
                    s->img_buffer = psVar21 + 1;
                    sVar9 = *psVar21;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar19;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar19;
                        s->img_buffer_end = psVar19 + iVar11;
                      }
                      psVar21 = s->img_buffer;
                      goto LAB_0011ab0e;
                    }
                    sVar9 = '\0';
                  }
                  palette[uVar25 * 4 + 2] = sVar9;
                  palette[uVar25 * 4 + 3] = 0xff;
                  uVar25 = uVar25 + 1;
                } while (local_4d8 != uVar25);
              }
              goto LAB_0011ab64;
            }
            pcVar24 = "invalid PLTE";
LAB_0011ab84:
            *puVar18 = pcVar24;
            bVar4 = false;
LAB_0011a8f8:
            bVar3 = false;
            local_52c = 0;
            goto LAB_0011abdf;
          }
          if (uVar28 != 0x49484452) goto LAB_0011a83f;
          if (bVar4) {
            if (uVar15 != 0xd) {
              pcVar24 = "bad IHDR len";
              goto LAB_0011ab46;
            }
            iVar11 = stbi__get16be(s);
            uVar15 = stbi__get16be(s);
            psVar19 = local_4a0;
            uVar15 = uVar15 | iVar11 << 0x10;
            s->img_x = uVar15;
            if (0x1000000 < uVar15) {
LAB_0011a7e8:
              pcVar24 = "too large";
              goto LAB_0011ab46;
            }
            iVar11 = stbi__get16be(s);
            uVar15 = stbi__get16be(s);
            uVar15 = uVar15 | iVar11 << 0x10;
            s->img_y = uVar15;
            if (0x1000000 < uVar15) goto LAB_0011a7e8;
            pbVar22 = s->img_buffer;
            if (pbVar22 < s->img_buffer_end) {
LAB_0011b38d:
              s->img_buffer = pbVar22 + 1;
              bVar8 = *pbVar22;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar19;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar19;
                  s->img_buffer_end = psVar19 + iVar11;
                }
                pbVar22 = s->img_buffer;
                goto LAB_0011b38d;
              }
              bVar8 = 0;
            }
            z->depth = (uint)bVar8;
            if ((0x10 < bVar8) || ((0x10116U >> (bVar8 & 0x1f) & 1) == 0)) {
              pcVar24 = "1/2/4/8/16-bit only";
              goto LAB_0011ab46;
            }
            pbVar22 = s->img_buffer;
            if (pbVar22 < s->img_buffer_end) {
LAB_0011b4af:
              s->img_buffer = pbVar22 + 1;
              bVar8 = *pbVar22;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar19;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar19;
                  s->img_buffer_end = psVar19 + iVar11;
                }
                pbVar22 = s->img_buffer;
                goto LAB_0011b4af;
              }
              bVar8 = 0;
            }
            color = (uint)bVar8;
            if (bVar8 < 7) {
              if (bVar8 != 3) {
                bVar10 = bVar7;
                if ((bVar8 & 1) == 0) goto LAB_0011b529;
                goto LAB_0011b4c6;
              }
              bVar10 = 3;
              if (z->depth == 0x10) {
                *puVar18 = "bad ctype";
                color = 3;
                goto LAB_0011b4dc;
              }
LAB_0011b529:
              bVar7 = bVar10;
              psVar21 = s->img_buffer;
              if (psVar21 < s->img_buffer_end) {
LAB_0011b695:
                s->img_buffer = psVar21 + 1;
                if (*psVar21 == '\0') goto LAB_0011b6b6;
                pcVar24 = "bad comp method";
LAB_0011b753:
                *puVar18 = pcVar24;
                bVar23 = false;
                local_52c = 0;
                goto LAB_0011ab53;
              }
              if (s->read_from_callbacks != 0) {
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar19;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar19;
                  s->img_buffer_end = psVar19 + iVar11;
                }
                psVar21 = s->img_buffer;
                goto LAB_0011b695;
              }
LAB_0011b6b6:
              sVar9 = stbi__get8(s);
              if (sVar9 != '\0') {
                pcVar24 = "bad filter method";
                goto LAB_0011b753;
              }
              bVar10 = stbi__get8(s);
              local_468 = (ulong)bVar10;
              if (1 < bVar10) {
                pcVar24 = "bad interlace method";
                goto LAB_0011b753;
              }
              uVar15 = s->img_x;
              if ((uVar15 == 0) || (uVar12 = s->img_y, uVar12 == 0)) {
                pcVar24 = "0-pixel image";
                goto LAB_0011b753;
              }
              if (bVar7 == 0) {
                uVar13 = (3 < bVar8) + 1 + (bVar8 & 2);
                s->img_n = uVar13;
                if ((uint)((0x40000000 / (ulong)uVar15) / (ulong)uVar13) < uVar12) {
                  *puVar18 = "too large";
                  bVar7 = 0;
                  goto LAB_0011ab4b;
                }
                if (scan != 2) goto LAB_0011b7d8;
                local_52c = 1;
                bVar23 = false;
                bVar7 = 0;
                goto LAB_0011ab53;
              }
              s->img_n = 1;
              if (uVar12 <= (uint)(0x40000000 / (ulong)uVar15 >> 2)) {
LAB_0011b7d8:
                bVar23 = true;
                goto LAB_0011ab53;
              }
              *puVar18 = "too large";
              goto LAB_0011ab4b;
            }
LAB_0011b4c6:
            *puVar18 = "bad ctype";
LAB_0011b4dc:
            bVar23 = false;
            local_52c = 0;
          }
          else {
            pcVar24 = "multiple IHDR";
LAB_0011ab46:
            *puVar18 = pcVar24;
LAB_0011ab4b:
            bVar23 = false;
            local_52c = 0;
          }
LAB_0011ab53:
          bVar4 = false;
          bVar3 = false;
          if (bVar23) goto LAB_0011ab64;
        }
LAB_0011abdf:
      } while (bVar3);
    }
  }
  return local_52c;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}